

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

InstanceBuilder * __thiscall
vkb::InstanceBuilder::enable_extensions(InstanceBuilder *this,size_t count,char **extensions)

{
  bool bVar1;
  
  if (count != 0 && extensions != (char **)0x0) {
    while (bVar1 = count != 0, count = count - 1, bVar1) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (&(this->info).extensions,extensions);
      extensions = extensions + 1;
    }
  }
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::enable_extensions(size_t count, const char* const* extensions) {
    if (!extensions || count == 0) return *this;
    for (size_t i = 0; i < count; i++) {
        info.extensions.push_back(extensions[i]);
    }
    return *this;
}